

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# match.h
# Opt level: O0

bool __thiscall
wasm::Match::Internal::
Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>
::matches(Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>
          *this,candidate_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>_>
                *candidate)

{
  bool bVar1;
  bool local_b3;
  Literal local_98;
  Literal local_78;
  MatchSelf<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>_> local_5d [13];
  Literal local_50;
  undefined1 local_38 [8];
  matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>_> casted;
  candidate_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>_> *candidate_local;
  Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>
  *this_local;
  
  casted.type.id = (uintptr_t)candidate;
  wasm::Literal::Literal((Literal *)local_38);
  wasm::Literal::Literal(&local_50,candidate);
  bVar1 = dynCastCandidate<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,_0>
                    (&local_50,
                     (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>_> *)
                     local_38);
  wasm::Literal::~Literal(&local_50);
  if (bVar1) {
    if (this->binder !=
        (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>_> *)0x0) {
      wasm::Literal::operator=(this->binder,(Literal *)local_38);
    }
    wasm::Literal::Literal(&local_78,(Literal *)local_38);
    bVar1 = MatchSelf<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>_>::operator()
                      (local_5d,&local_78);
    local_b3 = false;
    if (bVar1) {
      wasm::Literal::Literal(&local_98,(Literal *)local_38);
      local_b3 = Components<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,_0,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>
                 ::match(&local_98,&this->submatchers);
    }
    this_local._7_1_ = local_b3;
    if (bVar1) {
      wasm::Literal::~Literal(&local_98);
    }
    wasm::Literal::~Literal(&local_78);
  }
  else {
    this_local._7_1_ = false;
  }
  wasm::Literal::~Literal((Literal *)local_38);
  return this_local._7_1_;
}

Assistant:

inline bool matches(candidate_t<Kind> candidate) {
    matched_t<Kind> casted;
    if (dynCastCandidate<Kind>(candidate, casted)) {
      if (binder != nullptr) {
        *binder = casted;
      }
      return MatchSelf<Kind>{}(casted, data) &&
             Components<Kind, 0, Matchers...>::match(casted, submatchers);
    }
    return false;
  }